

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token)

{
  ushort uVar1;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  _Elt_pointer ppVVar4;
  Location pCVar5;
  bool bVar6;
  _Elt_pointer ppVVar7;
  _Elt_pointer ppVVar8;
  Value decoded;
  ValueHolder local_40;
  ushort local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  local_38 = local_38 & 0xfe00;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  bVar6 = decodeDouble(this,token,(Value *)&local_40);
  if (bVar6) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = &ppVVar7[-1]->value_;
    uVar1 = *(ushort *)(pVVar2 + 1);
    *(ushort *)(pVVar2 + 1) = uVar1 & 0xff00 | local_38 & 0xff;
    VVar3 = *pVVar2;
    *pVVar2 = local_40;
    *(ushort *)(pVVar2 + 1) = uVar1 & 0xfe00 | local_38 & 0xff | local_38 & 0x100;
    local_38 = local_38 & 0xfe00 | uVar1 & 0xff | uVar1 & 0x100;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar8 = ppVVar7;
    if (ppVVar7 == ppVVar4) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar5 = this->begin_;
    ppVVar8[-1]->start_ = (long)token->start_ - (long)pCVar5;
    if (ppVVar7 == ppVVar4) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar7[-1]->limit_ = (long)token->end_ - (long)pCVar5;
    local_40 = VVar3;
  }
  Value::~Value((Value *)&local_40);
  return bVar6;
}

Assistant:

bool Reader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}